

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffx.c
# Opt level: O0

int ptls_ffx_setup_crypto
              (ptls_cipher_context_t *_ctx,ptls_cipher_algorithm_t *algo,int is_enc,int nb_rounds,
              size_t bit_length,void *key)

{
  uint8_t auVar1 [8];
  uint8_t local_58 [8];
  uint8_t last_byte_mask [8];
  size_t len;
  ptls_cipher_context_t *enc_ctx;
  ptls_ffx_context_t *ctx;
  int ret;
  void *key_local;
  size_t bit_length_local;
  int nb_rounds_local;
  int is_enc_local;
  ptls_cipher_algorithm_t *algo_local;
  ptls_cipher_context_t *_ctx_local;
  
  ctx._4_4_ = 0;
  len = 0;
  auVar1 = (uint8_t  [8])(bit_length + 7 >> 3);
  last_byte_mask[0] = auVar1[0];
  last_byte_mask[1] = auVar1[1];
  last_byte_mask[2] = auVar1[2];
  last_byte_mask[3] = auVar1[3];
  last_byte_mask[4] = auVar1[4];
  last_byte_mask[5] = auVar1[5];
  last_byte_mask[6] = auVar1[6];
  last_byte_mask[7] = auVar1[7];
  local_58[0] = 0xff;
  local_58[1] = 0xfe;
  local_58[2] = 0xfc;
  local_58[3] = 0xf8;
  local_58[4] = 0xf0;
  local_58[5] = 0xe0;
  local_58[6] = 0xc0;
  local_58[7] = 0x80;
  if ((0x20 < (ulong)auVar1) || ((ulong)auVar1 < 2)) {
    __assert_fail("len <= 32 && len >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x29,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_dispose != (_func_void_st_ptls_cipher_context_t_ptr *)0x0) {
    __assert_fail("ctx->super.do_dispose == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2a,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_init != (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)0x0) {
    __assert_fail("ctx->super.do_init == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2b,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (_ctx->do_transform != (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)0x0)
  {
    __assert_fail("ctx->super.do_transform == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2c,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if ((_ctx->algo != (st_ptls_cipher_algorithm_t *)0x0) && (algo->key_size != _ctx->algo->key_size))
  {
    __assert_fail("ctx->super.algo == NULL || algo->key_size == ctx->super.algo->key_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2d,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if ((_ctx->algo != (st_ptls_cipher_algorithm_t *)0x0) && (algo->iv_size != _ctx->algo->iv_size)) {
    __assert_fail("ctx->super.algo == NULL || algo->iv_size == ctx->super.algo->iv_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2e,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if ((_ctx->algo != (st_ptls_cipher_algorithm_t *)0x0) &&
     ((uint8_t  [8])_ctx->algo->block_size != auVar1)) {
    __assert_fail("ctx->super.algo == NULL || ctx->super.algo->block_size == len",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x2f,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (algo->iv_size != 0x10) {
    __assert_fail("algo->iv_size == 16",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/ffx.c",0x30,
                  "int ptls_ffx_setup_crypto(ptls_cipher_context_t *, ptls_cipher_algorithm_t *, int, int, size_t, const void *)"
                 );
  }
  if (((ulong)auVar1 < 0x21) && (1 < (ulong)auVar1)) {
    len = (size_t)ptls_cipher_new(algo,1,key);
    if ((ptls_cipher_context_t *)len == (ptls_cipher_context_t *)0x0) {
      ctx._4_4_ = 0x203;
    }
  }
  else {
    ctx._4_4_ = 0x203;
  }
  if (ctx._4_4_ == 0) {
    _ctx[1].algo = (st_ptls_cipher_algorithm_t *)len;
    *(int *)&_ctx[1].do_dispose = nb_rounds;
    *(int *)((long)&_ctx[1].do_dispose + 4) = is_enc;
    _ctx[1].do_init = (_func_void_st_ptls_cipher_context_t_ptr_void_ptr *)last_byte_mask;
    _ctx[1].do_transform =
         (_func_void_st_ptls_cipher_context_t_ptr_void_ptr_void_ptr_size_t *)
         (long)(int)((long)((ulong)(uint)(last_byte_mask._0_4_ >> 0x1f) << 0x20 |
                           (ulong)last_byte_mask & 0xffffffff) / 2);
    _ctx[2].algo = (st_ptls_cipher_algorithm_t *)
                   ((long)last_byte_mask._0_4_ - (long)_ctx[1].do_transform);
    *(uint8_t *)&_ctx[2].do_dispose = last_byte_mask[(bit_length & 7) - 8];
    (*ptls_clear_memory)((void *)((long)&_ctx[2].do_dispose + 1),0x10);
    _ctx->do_dispose = ffx_dispose;
    _ctx->do_init = ffx_init;
    _ctx->do_transform = ffx_encrypt;
  }
  else {
    ffx_dispose(_ctx);
  }
  return ctx._4_4_;
}

Assistant:

int ptls_ffx_setup_crypto(ptls_cipher_context_t *_ctx, ptls_cipher_algorithm_t *algo, int is_enc, int nb_rounds, size_t bit_length,
                          const void *key)
{
    int ret = 0;
    ptls_ffx_context_t *ctx = (ptls_ffx_context_t *)_ctx;
    ptls_cipher_context_t *enc_ctx = NULL;
    size_t len = (bit_length + 7) / 8;
    uint8_t last_byte_mask[8] = {0xFF, 0xFE, 0xFC, 0xF8, 0xF0, 0xE0, 0xC0, 0x80};

    assert(len <= 32 && len >= 2);
    assert(ctx->super.do_dispose == NULL);
    assert(ctx->super.do_init == NULL);
    assert(ctx->super.do_transform == NULL);
    assert(ctx->super.algo == NULL || algo->key_size == ctx->super.algo->key_size);
    assert(ctx->super.algo == NULL || algo->iv_size == ctx->super.algo->iv_size);
    assert(ctx->super.algo == NULL || ctx->super.algo->block_size == len);
    assert(algo->iv_size == 16);

    if (len <= 32 && len >= 2) {
        /* len must be lower than 32 */
        enc_ctx = ptls_cipher_new(algo, 1, key);

        if (enc_ctx == NULL) {
            ret = PTLS_ERROR_LIBRARY;
        }
    } else {
        ret = PTLS_ERROR_LIBRARY;
    }

    if (ret == 0) {
        ctx->enc_ctx = enc_ctx;
        ctx->nb_rounds = nb_rounds;
        ctx->is_enc = is_enc;
        ctx->byte_length = len;
        ctx->nb_left = (int)len / 2;
        ctx->nb_right = (int)len - ctx->nb_left;
        ctx->mask_last_byte = last_byte_mask[bit_length % 8];
        ptls_clear_memory(ctx->tweaks, sizeof(ctx->tweaks));

        ctx->super.do_dispose = ffx_dispose;
        ctx->super.do_init = ffx_init;
        ctx->super.do_transform = ffx_encrypt;
    } else {
        ffx_dispose(_ctx);
    }

    return ret;
}